

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<Qt::DayOfWeek>::relocate
          (QArrayDataPointer<Qt::DayOfWeek> *this,qsizetype offset,DayOfWeek **data)

{
  DayOfWeek *d_first;
  DayOfWeek *pDVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<Qt::DayOfWeek,long_long>(this->ptr,this->size,d_first);
  if (data != (DayOfWeek **)0x0) {
    pDVar1 = *data;
    if ((this->ptr <= pDVar1) && (pDVar1 < this->ptr + this->size)) {
      *data = pDVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }